

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall sf::Text::setOutlineColor(Text *this,Color *color)

{
  bool bVar1;
  size_t sVar2;
  Vertex *pVVar3;
  size_t i;
  ulong index;
  
  bVar1 = sf::operator!=(color,&this->m_outlineColor);
  if ((bVar1) && (this->m_outlineColor = *color, this->m_geometryNeedUpdate == false)) {
    index = 0;
    while( true ) {
      sVar2 = VertexArray::getVertexCount(&this->m_outlineVertices);
      if (sVar2 <= index) break;
      pVVar3 = VertexArray::operator[](&this->m_outlineVertices,index);
      pVVar3->color = this->m_outlineColor;
      index = index + 1;
    }
  }
  return;
}

Assistant:

void Text::setOutlineColor(const Color& color)
{
    if (color != m_outlineColor)
    {
        m_outlineColor = color;

        // Change vertex colors directly, no need to update whole geometry
        // (if geometry is updated anyway, we can skip this step)
        if (!m_geometryNeedUpdate)
        {
            for (std::size_t i = 0; i < m_outlineVertices.getVertexCount(); ++i)
                m_outlineVertices[i].color = m_outlineColor;
        }
    }
}